

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::findDeclaration(SourceCodeOperations *this,ModuleBase *target)

{
  ModuleDeclaration *pMVar1;
  ModuleDeclaration *pMVar2;
  ModuleBase *pMVar3;
  ModuleDeclaration *pMVar4;
  ModuleDeclaration *pMVar5;
  bool bVar6;
  
  pMVar1 = (this->allModules).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->allModules).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pMVar1 == pMVar2;
  pMVar4 = pMVar1;
  if (!bVar6) {
    pMVar3 = pMVar1->module;
    pMVar5 = pMVar1;
    while (pMVar4 = pMVar5, pMVar3 != target) {
      pMVar5 = pMVar5 + 1;
      bVar6 = pMVar5 == pMVar2;
      pMVar4 = pMVar1;
      if (bVar6) break;
      pMVar3 = pMVar5->module;
    }
  }
  if (bVar6) {
    throwInternalCompilerError("findDeclaration",0x81);
  }
  return pMVar4;
}

Assistant:

SourceCodeOperations::ModuleDeclaration* SourceCodeOperations::findDeclaration (AST::ModuleBase& target)
{
    for (auto& m : allModules)
        if (std::addressof (m.module) == std::addressof (target))
            return std::addressof (m);

    SOUL_ASSERT_FALSE;
    return {};
}